

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhighdpiscaling_p.h
# Opt level: O3

QPoint QHighDpi::fromNativeLocalPosition<QPoint,QWindow>(QPoint *value,QWindow *context)

{
  undefined1 auVar1 [16];
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  ScaleAndOrigin SVar8;
  
  SVar8 = QHighDpiScaling::scaleAndOrigin(context,(Point)ZEXT812(0));
  dVar6 = 1.0 / SVar8.factor;
  dVar7 = dVar6 * (double)(*value).xp.m_i;
  dVar6 = dVar6 * (double)(*value).yp.m_i;
  dVar7 = (double)((ulong)dVar7 & 0x8000000000000000 | 0x3fe0000000000000) + dVar7;
  dVar6 = (double)((ulong)dVar6 & 0x8000000000000000 | 0x3fe0000000000000) + dVar6;
  auVar1._4_4_ = -(uint)(-2147483648.0 < dVar7);
  auVar1._0_4_ = -(uint)(-2147483648.0 < dVar6);
  auVar1._8_4_ = -(uint)(2147483647.0 < dVar6);
  auVar1._12_4_ = -(uint)(2147483647.0 < dVar7);
  uVar2 = movmskps(SVar8.origin.xp.m_i,auVar1);
  uVar5 = 0x80000000;
  if ((uVar2 & 2) != 0) {
    uVar5 = (ulong)(uint)(int)dVar7;
  }
  uVar3 = 0x8000000000000000;
  if ((uVar2 & 1) != 0) {
    uVar3 = (ulong)(uint)(int)dVar6 << 0x20;
  }
  uVar4 = 0x7fffffff00000000;
  if ((uVar2 & 4) == 0) {
    uVar4 = uVar3;
  }
  uVar3 = 0x7fffffff;
  if ((uVar2 & 8) == 0) {
    uVar3 = uVar5;
  }
  return (QPoint)(uVar3 | uVar4);
}

Assistant:

T fromNativeLocalPosition(const T &value, const C *context)
{
    return scale(value, qreal(1) / QHighDpiScaling::factor(context));
}